

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O2

void __thiscall CProjectile::Snap(CProjectile *this,int SnappingClient)

{
  IServer *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  vec2 CheckPos;
  
  pIVar1 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
  CheckPos = GetPos(this,(float)(pIVar1->m_CurrentGameTick - this->m_StartTick) /
                         (float)pIVar1->m_TickSpeed);
  iVar2 = CEntity::NetworkClipped(&this->super_CEntity,SnappingClient,CheckPos);
  if (iVar2 == 0) {
    pIVar1 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
    iVar2 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
                      (pIVar1,2,(ulong)(uint)(this->super_CEntity).m_ID,0x18);
    if ((CNetObj_Projectile *)CONCAT44(extraout_var,iVar2) != (CNetObj_Projectile *)0x0) {
      FillInfo(this,(CNetObj_Projectile *)CONCAT44(extraout_var,iVar2));
      return;
    }
  }
  return;
}

Assistant:

void CProjectile::Snap(int SnappingClient)
{
	float Ct = (Server()->Tick()-m_StartTick)/(float)Server()->TickSpeed();

	if(NetworkClipped(SnappingClient, GetPos(Ct)))
		return;

	CNetObj_Projectile *pProj = static_cast<CNetObj_Projectile *>(Server()->SnapNewItem(NETOBJTYPE_PROJECTILE, GetID(), sizeof(CNetObj_Projectile)));
	if(pProj)
		FillInfo(pProj);
}